

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

void modify_arm_cp_regs_aarch64(ARMCPRegInfo_conflict *regs,ARMCPRegUserSpaceInfo *mods)

{
  ulong uVar1;
  ulong uVar2;
  gboolean gVar3;
  int iVar4;
  GPatternSpec *local_30;
  GPatternSpec *pat;
  ARMCPRegInfo_conflict *r;
  ARMCPRegUserSpaceInfo *m;
  ARMCPRegUserSpaceInfo *mods_local;
  ARMCPRegInfo_conflict *regs_local;
  
  r = (ARMCPRegInfo_conflict *)mods;
  do {
    if (r->name == (char *)0x0) {
      return;
    }
    local_30 = (GPatternSpec *)0x0;
    pat = (GPatternSpec *)regs;
    if ((r->cp & 1) != 0) {
      local_30 = g_pattern_spec_new(r->name);
    }
    for (; *(int *)((long)&pat->pattern + 4) != 0xfffff; pat = (GPatternSpec *)&pat[5].pattern) {
      if ((local_30 == (GPatternSpec *)0x0) ||
         (gVar3 = g_pattern_match_string(local_30,*(gchar **)pat), gVar3 == 0)) {
        iVar4 = strcmp(*(char **)pat,r->name);
        if (iVar4 == 0) {
          *(undefined4 *)((long)&pat->pattern + 4) = 2;
          pat[1].match_type = 0xa8;
          uVar1._0_4_ = r->state;
          uVar1._4_4_ = r->type;
          pat[1].pattern = (gchar *)(uVar1 & (ulong)pat[1].pattern);
          uVar2._0_4_ = r->access;
          uVar2._4_4_ = r->secure;
          pat[1].pattern = (gchar *)(uVar2 | (ulong)pat[1].pattern);
          break;
        }
      }
      else {
        *(undefined4 *)((long)&pat->pattern + 4) = 2;
        pat[1].match_type = 0xa8;
        pat[1].pattern = (gchar *)0x0;
      }
    }
    if (local_30 != (GPatternSpec *)0x0) {
      g_pattern_spec_free(local_30);
    }
    r = (ARMCPRegInfo_conflict *)&r->opaque;
  } while( true );
}

Assistant:

void modify_arm_cp_regs(ARMCPRegInfo *regs, const ARMCPRegUserSpaceInfo *mods)
{
    const ARMCPRegUserSpaceInfo *m;
    ARMCPRegInfo *r;

    for (m = mods; m->name; m++) {
        GPatternSpec *pat = NULL;
        if (m->is_glob) {
            pat = g_pattern_spec_new(m->name);
        }
        for (r = regs; r->type != ARM_CP_SENTINEL; r++) {
            if (pat && g_pattern_match_string(pat, r->name)) {
                r->type = ARM_CP_CONST;
                r->access = PL0U_R;
                r->resetvalue = 0;
                /* continue */
            } else if (strcmp(r->name, m->name) == 0) {
                r->type = ARM_CP_CONST;
                r->access = PL0U_R;
                r->resetvalue &= m->exported_bits;
                r->resetvalue |= m->fixed_bits;
                break;
            }
        }
        if (pat) {
            g_pattern_spec_free(pat);
        }
    }
}